

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHolder.hpp
# Opt level: O0

void __thiscall
OpenMD::DataHolder::assign<std::vector<double,std::allocator<double>>>
          (DataHolder *this,string *keyword,vector<double,_std::allocator<double>_> *val)

{
  ParameterBase *pPVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  pointer ppVar5;
  OpenMDException *this_00;
  string *msg;
  ostream *poVar6;
  undefined8 uVar7;
  void *in_RDX;
  string *in_RSI;
  stringstream ss_1;
  stringstream ss;
  bool result;
  iterator i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffba8;
  key_type *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  OpenMDException *in_stack_fffffffffffffbc0;
  vector<double,_std::allocator<double>_> *__x;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  stringstream local_3c0 [16];
  ostream local_3b0 [376];
  _Self local_238;
  _Self local_230;
  undefined1 local_221;
  string local_200 [32];
  stringstream local_1e0 [16];
  ostream local_1d0 [392];
  vector<double,_std::allocator<double>_> local_48;
  byte local_29;
  _Self local_28;
  _Self local_20 [2];
  string *local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
               *)in_stack_fffffffffffffba8,(key_type *)0x1af382);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
              *)in_stack_fffffffffffffba8);
  bVar2 = std::operator!=(local_20,&local_28);
  if (bVar2) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                           *)0x1af3cb);
    pPVar1 = ppVar5->second;
    __x = &local_48;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),__x);
    iVar4 = (*pPVar1->_vptr_ParameterBase[8])(pPVar1,__x);
    bVar3 = (byte)iVar4;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0);
    local_29 = bVar3 & 1;
    if (local_29 == 0) {
      std::__cxx11::stringstream::stringstream(local_1e0);
      poVar6 = std::operator<<(local_1d0,"Error in parsing ");
      poVar6 = std::operator<<(poVar6,local_10);
      poVar6 = std::operator<<(poVar6,": expected ");
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                             *)0x1af492);
      (*ppVar5->second->_vptr_ParameterBase[9])(local_200);
      poVar6 = std::operator<<(poVar6,local_200);
      poVar6 = std::operator<<(poVar6," but got ");
      this_00 = (OpenMDException *)std::ostream::operator<<(poVar6,in_RDX);
      std::operator<<((ostream *)this_00,"\n");
      std::__cxx11::string::~string(local_200);
      local_221 = 1;
      msg = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      OpenMDException::OpenMDException(this_00,msg);
      local_221 = 0;
      __cxa_throw(msg,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
  }
  else {
    local_230._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    local_238._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffffba8);
    bVar2 = std::operator!=(&local_230,&local_238);
    if (!bVar2) {
      std::__cxx11::stringstream::stringstream(local_3c0);
      poVar6 = std::operator<<(local_3b0,local_10);
      std::operator<<(poVar6," is not a recognized keyword.\n");
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      OpenMDException::OpenMDException(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    uVar7 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "%s keyword has been deprecated in OpenMD. Please update your .omd file.\n",uVar7);
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
  }
  return;
}

Assistant:

void assign(const std::string& keyword, T val) {
      ParamMap::iterator i = parameters_.find(keyword);
      if (i != parameters_.end()) {
        bool result = i->second->setData(val);
        if (!result) {
          std::stringstream ss;
          ss << "Error in parsing " << keyword << ": expected "
             << i->second->getParamType() << " but got " << &val << "\n";
          throw OpenMDException(ss.str());
        }
      } else if (deprecatedKeywords_.find(keyword) !=
                 deprecatedKeywords_.end()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "%s keyword has been deprecated in OpenMD. Please update your "
                 ".omd file.\n",
                 keyword.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
      } else {
        std::stringstream ss;
        ss << keyword << " is not a recognized keyword.\n";
        throw OpenMDException(ss.str());
      }
    }